

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_api.h
# Opt level: O2

void __thiscall dummy_api::set_response_headers(dummy_api *this,response_headers *h)

{
  string_buffer_wrapper wr;
  
  wr.string_._M_dataplus._M_p = (pointer)&wr.string_.field_2;
  wr.string_._M_string_length = 0;
  wr.string_.field_2._M_local_buf[0] = '\0';
  cppcms::impl::response_headers::
  format_cgi_headers<cppcms::impl::response_headers::string_buffer_wrapper>(h,&wr,true);
  std::__cxx11::string::_M_assign((string *)&this->headers_);
  std::__cxx11::string::~string((string *)&wr);
  return;
}

Assistant:

virtual void set_response_headers(cppcms::impl::response_headers &h) 
	{
		cppcms::impl::response_headers::string_buffer_wrapper wr;
		h.format_cgi_headers(wr,true);
		headers_ = wr.data();
	}